

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::BindingUniformBlocksTest::prepareUniforms
          (BindingUniformBlocksTest *this,program *program)

{
  program *program_local;
  BindingUniformBlocksTest *this_local;
  
  Utils::buffer::generate(&this->m_goku_buffer,0x8a11);
  Utils::buffer::generate(&this->m_vegeta_buffer,0x8a11);
  Utils::buffer::generate(&this->m_children_buffer,0x8a11);
  Utils::buffer::update(&this->m_goku_buffer,0x10,prepareUniforms::goku_data,0x88e4);
  Utils::buffer::update(&this->m_vegeta_buffer,0xc,prepareUniforms::vegeta_data,0x88e4);
  Utils::buffer::update(&this->m_children_buffer,0x20,prepareUniforms::children_data,0x88e4);
  Utils::buffer::bindRange(&this->m_goku_buffer,0,0,0x10);
  Utils::buffer::bindRange(&this->m_vegeta_buffer,1,0,0xc);
  Utils::buffer::bindRange(&this->m_children_buffer,3,0,0x20);
  return;
}

Assistant:

void BindingUniformBlocksTest::prepareUniforms(Utils::program& program)
{
	(void)program;
	static const GLfloat goku_data[4]	 = { 1.0f, 0.0f, 0.0f, 0.0f };
	static const GLfloat vegeta_data[3]   = { 0.0f, 1.0f, 0.0f };
	static const GLfloat children_data[8] = { 0.0f, 0.0f, 1.0f, 0.0f, 0.0f, 0.0f, 0.0f, 1.0f };

	m_goku_buffer.generate(GL_UNIFORM_BUFFER);
	m_vegeta_buffer.generate(GL_UNIFORM_BUFFER);
	m_children_buffer.generate(GL_UNIFORM_BUFFER);

	m_goku_buffer.update(sizeof(goku_data), (GLvoid*)goku_data, GL_STATIC_DRAW);
	m_vegeta_buffer.update(sizeof(vegeta_data), (GLvoid*)vegeta_data, GL_STATIC_DRAW);
	m_children_buffer.update(sizeof(children_data), (GLvoid*)children_data, GL_STATIC_DRAW);

	m_goku_buffer.bindRange(0 /* index */, 0 /* offset */, sizeof(goku_data));
	m_vegeta_buffer.bindRange(1 /* index */, 0 /* offset */, sizeof(vegeta_data));
	m_children_buffer.bindRange(3 /* index */, 0 /* offset */, sizeof(children_data));
}